

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

void fsg_model_write(fsg_model_t *fsg,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  fsg_arciter_t *itor;
  gnode_t *pgVar4;
  char *pcVar5;
  int32 i;
  
  pcVar5 = fsg->name;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "";
  }
  i = 0;
  fprintf((FILE *)fp,"%s %s\n","FSG_BEGIN",pcVar5);
  fprintf((FILE *)fp,"%s %d\n","NUM_STATES",(ulong)(uint)fsg->n_state);
  fprintf((FILE *)fp,"%s %d\n","START_STATE",(ulong)(uint)fsg->start_state);
  fprintf((FILE *)fp,"%s %d\n","FINAL_STATE",(ulong)(uint)fsg->final_state);
  if (0 < fsg->n_state) {
    do {
      for (itor = fsg_model_arcs(fsg,i); itor != (fsg_arciter_t *)0x0; itor = fsg_arciter_next(itor)
          ) {
        pgVar4 = itor->gn;
        if (pgVar4 == (gnode_t *)0x0) {
          pgVar4 = (gnode_t *)&itor->null_itor->ent->val;
        }
        puVar3 = (uint *)(pgVar4->data).ptr;
        uVar1 = *puVar3;
        uVar2 = puVar3[1];
        logmath_exp(fsg->lmath,(int)((float)(int)puVar3[2] / (float)fsg->lw));
        pcVar5 = "";
        if (-1 < (long)(int)puVar3[3]) {
          pcVar5 = fsg->vocab[(int)puVar3[3]];
        }
        fprintf((FILE *)fp,"%s %d %d %f %s\n","TRANSITION",(ulong)uVar1,(ulong)uVar2,pcVar5);
      }
      i = i + 1;
    } while (i < fsg->n_state);
  }
  fprintf((FILE *)fp,"%s\n","FSG_END");
  fflush((FILE *)fp);
  return;
}

Assistant:

void
fsg_model_write(fsg_model_t * fsg, FILE * fp)
{
    int32 i;

    fprintf(fp, "%s %s\n", FSG_MODEL_BEGIN_DECL,
            fsg->name ? fsg->name : "");
    fprintf(fp, "%s %d\n", FSG_MODEL_NUM_STATES_DECL, fsg->n_state);
    fprintf(fp, "%s %d\n", FSG_MODEL_START_STATE_DECL, fsg->start_state);
    fprintf(fp, "%s %d\n", FSG_MODEL_FINAL_STATE_DECL, fsg->final_state);

    for (i = 0; i < fsg->n_state; i++) {
        fsg_arciter_t *itor;

        for (itor = fsg_model_arcs(fsg, i); itor;
             itor = fsg_arciter_next(itor)) {
            fsg_link_t *tl = fsg_arciter_get(itor);

            fprintf(fp, "%s %d %d %f %s\n", FSG_MODEL_TRANSITION_DECL,
                    tl->from_state, tl->to_state,
                    logmath_exp(fsg->lmath,
                                (int32) (tl->logs2prob / fsg->lw)),
                    (tl->wid < 0) ? "" : fsg_model_word_str(fsg, tl->wid));
        }
    }

    fprintf(fp, "%s\n", FSG_MODEL_END_DECL);

    fflush(fp);
}